

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O0

Object * __thiscall
nvim::NvimRPC::
do_call<long,long,long,bool,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (Object *__return_storage_ptr__,NvimRPC *this,string *method,long *u,long *u_1,long *u_2,
          bool *u_3,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *u_4)

{
  packer<msgpack::v1::sbuffer> *o;
  type ppVar1;
  char *pcVar2;
  void *__buf;
  object *poVar3;
  type *ptVar4;
  undefined1 local_118 [8];
  tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  dst;
  object obj;
  undefined1 local_98 [8];
  unpacked result;
  unsigned_long local_70 [3];
  packer<msgpack::v1::sbuffer> local_58;
  Packer pk;
  sbuffer sbuf;
  long *u_local_2;
  long *u_local_1;
  long *u_local;
  string *method_local;
  NvimRPC *this_local;
  
  msgpack::v1::sbuffer::sbuffer((sbuffer *)&pk,0x2000);
  msgpack::v1::packer<msgpack::v1::sbuffer>::packer(&local_58,(sbuffer *)&pk);
  o = msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&local_58,4);
  local_70[0] = 0;
  ppVar1 = msgpack::v1::operator<<(o,local_70);
  result.m_zone._M_t.
  super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
  super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
  super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl =
       (__uniq_ptr_data<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>,_true,_true>)
       this->msgid_;
  this->msgid_ = (long)result.m_zone._M_t.
                       super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>
                       .super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl + 1;
  ppVar1 = msgpack::v1::operator<<(ppVar1,(unsigned_long *)&result.m_zone);
  msgpack::v1::operator<<(ppVar1,method);
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&local_58,5);
  nvim::detail::
  pack<long,long,long,bool,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_58,u,u_1,u_2,u_3,u_4);
  pcVar2 = msgpack::v1::sbuffer::data((sbuffer *)&pk);
  __buf = (void *)msgpack::v1::sbuffer::size((sbuffer *)&pk);
  Socket::write(&this->socket_,(int)pcVar2,__buf,(size_t)u_2);
  Socket::read2((unpacked *)local_98,&this->socket_,5.0);
  poVar3 = msgpack::v1::object_handle::get((object_handle *)local_98);
  dst.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .super__Head_base<0UL,_long,_false>._M_head_impl = *(long *)&poVar3->super_object;
  msgpack::v1::type::
  tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  ::tuple<>((tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             *)local_118);
  msgpack::v2::object::
  convert<msgpack::v1::type::tuple<long,long,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>
            ((object *)
             &dst.
              super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .
              super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .super__Head_base<0UL,_long,_false>,
             (tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              *)local_118);
  ptVar4 = msgpack::v1::type::
           tuple<long,long,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
           ::get<3ul>((tuple<long,long,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
                       *)local_118);
  msgpack::v1::type::
  basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
  ::basic_variant(__return_storage_ptr__,ptVar4);
  msgpack::v1::type::
  tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  ::~tuple((tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
            *)local_118);
  msgpack::v1::object_handle::~object_handle((object_handle *)local_98);
  msgpack::v1::sbuffer::~sbuffer((sbuffer *)&pk);
  return __return_storage_ptr__;
}

Assistant:

Object NvimRPC::do_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    // msgpack::object_handle oh = msgpack::unpack(sbuf.data(), sbuf.size());
    // msgpack::object deserialized = oh.get();
    // std::cout << "sbuf = " << deserialized << std::endl;

    socket_.write(sbuf.data(), sbuf.size(), 5);

    msgpack::unpacked result = socket_.read2(5);
    msgpack::object obj(result.get());

    //TODO: full-state response handler should be implemented

    // std::cout << "res = " << obj << std::endl;
    msgpack::type::tuple<int64_t, int64_t, Object, Object> dst;
    // [type=1, msgid(uint), error(str?), result(...)]
    obj.convert(dst);
    return dst.get<3>();
}